

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgknm(char *card,char *name,int *length,int *status)

{
  char *pcVar1;
  bool bVar2;
  int local_50;
  int local_4c;
  int local_44;
  int namelength;
  int ii;
  char *ptr2;
  char *ptr1;
  int *status_local;
  int *length_local;
  char *name_local;
  char *card_local;
  
  *name = '\0';
  *length = 0;
  if (*card < 'H') {
    local_4c = -1;
  }
  else {
    if (*card < 'I') {
      local_50 = strncmp(card,"HIERARCH ",9);
    }
    else {
      local_50 = 1;
    }
    local_4c = local_50;
  }
  if (local_4c == 0) {
    pcVar1 = strchr(card,0x3d);
    if (pcVar1 == (char *)0x0) {
      strcat(name,"HIERARCH");
      *length = 8;
      return *status;
    }
    for (ptr2 = card + 9; *ptr2 == ' '; ptr2 = ptr2 + 1) {
    }
    strncat(name,ptr2,(long)pcVar1 - (long)ptr2);
    local_44 = (int)pcVar1 - (int)ptr2;
    while( true ) {
      bVar2 = false;
      if (0 < local_44) {
        bVar2 = name[local_44 + -1] == ' ';
      }
      if (!bVar2) break;
      local_44 = local_44 + -1;
    }
    name[local_44] = '\0';
    *length = local_44;
  }
  else {
    for (local_44 = 0; local_44 < 0x4a; local_44 = local_44 + 1) {
      if (((card[local_44] == ' ') || (card[local_44] == '=')) || (card[local_44] == '\0')) {
        name[local_44] = '\0';
        *length = local_44;
        return *status;
      }
      name[local_44] = card[local_44];
    }
    name[0x4a] = '\0';
    *length = 0x4a;
  }
  return *status;
}

Assistant:

int ffgknm( char *card,         /* I - keyword card                   */
            char *name,         /* O - name of the keyword            */
            int *length,        /* O - length of the keyword name     */
            int  *status)       /* IO - error status                  */

/*
  Return the name of the keyword, and the name length.  This supports the
  ESO HIERARCH convention where keyword names may be > 8 characters long.
*/
{
    char *ptr1, *ptr2;
    int ii, namelength;

    namelength = FLEN_KEYWORD - 1;
    *name = '\0';
    *length = 0;

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
        ptr2 = strchr(card, '=');

        if (!ptr2)   /* no value indicator ??? */
        {
            /* this probably indicates an error, so just return FITS name */
            strcat(name, "HIERARCH");
            *length = 8;
            return(*status);
        }

        /* find the start and end of the HIERARCH name */
        ptr1 = &card[9];
        while (*ptr1 == ' ')   /* skip spaces */
            ptr1++;

        strncat(name, ptr1, ptr2 - ptr1);
        ii = ptr2 - ptr1;

        while (ii > 0 && name[ii - 1] == ' ')  /* remove trailing spaces */
            ii--;

        name[ii] = '\0';
        *length = ii;
    }
    else
    {
        for (ii = 0; ii < namelength; ii++)
        {
           /* look for string terminator, or a blank */
           if (*(card+ii) != ' ' && *(card+ii) != '=' && *(card+ii) !='\0')
           {
               *(name+ii) = *(card+ii);
           }
           else
           {
               name[ii] = '\0';
               *length = ii;
               return(*status);
           }
        }

        /* if we got here, keyword is namelength characters long */
        name[namelength] = '\0';
        *length = namelength;
    }

    return(*status);
}